

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

void __thiscall
Well<unsigned_int,32ul,32ul,0ul,22ul,25ul,26ul,Detail::M3<-21>,Detail::M3<17>,Detail::M4<2346498334u>,Detail::M3<15>,Detail::M3<-14>,Detail::M3<-21>,Detail::M1,Detail::M0,Detail::NoTempering>
::seed<unsigned_int*>
          (Well<unsigned_int,32ul,32ul,0ul,22ul,25ul,26ul,Detail::M3<_21>,Detail::M3<17>,Detail::M4<2346498334u>,Detail::M3<15>,Detail::M3<_14>,Detail::M3<_21>,Detail::M1,Detail::M0,Detail::NoTempering>
           *this,uint **first,uint *last)

{
  invalid_argument *this_00;
  bool bVar1;
  long local_28;
  size_t i;
  uint *last_local;
  uint **first_local;
  Well<unsigned_int,_32UL,_32UL,_0UL,_22UL,_25UL,_26UL,_Detail::M3<_21>,_Detail::M3<17>,_Detail::M4<2346498334U>,_Detail::M3<15>,_Detail::M3<_14>,_Detail::M3<_21>,_Detail::M1,_Detail::M0,_Detail::NoTempering>
  *this_local;
  
  *(undefined8 *)(this + 0x80) = 0;
  local_28 = 0;
  while( true ) {
    bVar1 = false;
    if (local_28 != 0x20) {
      bVar1 = *first != last;
    }
    if (!bVar1) break;
    *(uint *)(this + local_28 * 4) = **first;
    local_28 = local_28 + 1;
    *first = *first + 1;
  }
  if ((*first == last) && (local_28 != 0x20)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Seed sequence too short");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        index_ = 0;
        std::size_t i = 0;

        for ( ; i != state_size && first != last; ++i, ++first)
            state_[i] = *first;

        if (first == last && i != state_size)
            throw std::invalid_argument("Seed sequence too short");
    }